

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O0

void __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_>::ComputeShape
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>_> *this,TPZVec<double> *intpoint,
          TPZVec<double> *X,TPZFMatrix<double> *jacobian,TPZFMatrix<double> *axes,REAL *detjac,
          TPZFMatrix<double> *jacinv,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
          TPZFMatrix<double> *dphix)

{
  TPZGeoEl *pTVar1;
  ostream *poVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  TPZGeoEl *ref;
  TPZFMatrix<double> *in_stack_000000b8;
  REAL *in_stack_000000c0;
  TPZFMatrix<double> *in_stack_000000c8;
  TPZFMatrix<double> *in_stack_000000d0;
  TPZVec<double> *in_stack_000000d8;
  TPZGeoEl *in_stack_000000e0;
  TPZCompEl *in_stack_ffffffffffffffc8;
  
  pTVar1 = TPZCompEl::Reference(in_stack_ffffffffffffffc8);
  if (pTVar1 == (TPZGeoEl *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\nERROR AT ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePiram>>::ComputeShape(TPZVec<REAL> &, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, REAL &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TCOMPEL = TPZCompElH1<pzshape::TPZShapePiram>]"
                            );
    std::operator<<(poVar2," - this->Reference() == NULL\n");
  }
  else {
    TPZGeoEl::Jacobian(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                       in_stack_000000c0,in_stack_000000b8);
    (**(code **)(*(long *)pTVar1 + 0x228))(pTVar1,in_RSI,in_RDX);
    (**(code **)(*in_RDI + 0x278))(in_RDI,in_RSI,ref,detjac);
  }
  return;
}

Assistant:

inline void TPZCompElPostProc<TCOMPEL>::ComputeShape(TPZVec<REAL> &intpoint, TPZVec<REAL> &X,
                                                     TPZFMatrix<REAL> &jacobian, TPZFMatrix<REAL> &axes,
                                                     REAL &detjac, TPZFMatrix<REAL> &jacinv,
                                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi, TPZFMatrix<REAL> &dphix){
    TPZGeoEl * ref = this->Reference();
    if (!ref){
        PZError << "\nERROR AT " << __PRETTY_FUNCTION__ << " - this->Reference() == NULL\n";
        return;
    }//if
    ref->Jacobian( intpoint, jacobian, axes, detjac , jacinv);
    
    ref->X(intpoint, X);
    //  this->Shape(intpoint,intpoint,phi,dphix);
    this->Shape(intpoint,phi,dphi);
    //this->Shape(intpoint,X,phi,dphix);
    
    //    ///axes is identity in discontinuous elements
    //    axes.Resize(dphix.Rows(), dphix.Rows());
    //    axes.Identity();
}